

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O2

QList<QGraphicsItem_*> * __thiscall
QGraphicsSceneBspTreeIndexPrivate::estimateItems
          (QList<QGraphicsItem_*> *__return_storage_ptr__,QGraphicsSceneBspTreeIndexPrivate *this,
          QRectF *rect,SortOrder order,bool onlyTopLevelItems)

{
  bool bVar1;
  undefined3 in_register_00000081;
  int i;
  ulong uVar2;
  long in_FS_OFFSET;
  QGraphicsItem *item;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (CONCAT31(in_register_00000081,onlyTopLevelItems) == 0) {
    purgeRemovedItems(this);
    _q_updateSortCache(this);
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneBspTree::items(__return_storage_ptr__,&this->bsp,rect,false);
    QList<QGraphicsItem_*>::append(__return_storage_ptr__,&this->untransformableItems);
  }
  else {
    if ((((rect->w == 0.0) && (!NAN(rect->w))) && (rect->h == 0.0)) && (!NAN(rect->h))) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QGraphicsSceneIndex::estimateTopLevelItems
                  (__return_storage_ptr__,
                   *(QGraphicsSceneIndex **)&(this->super_QGraphicsSceneIndexPrivate).field_0x8,rect
                   ,order);
        return __return_storage_ptr__;
      }
      goto LAB_005b3049;
    }
    purgeRemovedItems(this);
    _q_updateSortCache(this);
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneBspTree::items(__return_storage_ptr__,&this->bsp,rect,true);
    for (uVar2 = 0; uVar2 < (ulong)(this->untransformableItems).d.size; uVar2 = uVar2 + 1) {
      item = (this->untransformableItems).d.ptr[uVar2];
      if (((item->d_ptr).d)->parent == (QGraphicsItem *)0x0) {
LAB_005b303c:
        QList<QGraphicsItem_*>::append(__return_storage_ptr__,item);
      }
      else {
        item = QGraphicsItem::topLevelItem(item);
        bVar1 = QListSpecialMethodsBase<QGraphicsItem*>::contains<QGraphicsItem*>
                          ((QListSpecialMethodsBase<QGraphicsItem*> *)__return_storage_ptr__,&item);
        if (!bVar1) goto LAB_005b303c;
      }
    }
  }
  sortItems(__return_storage_ptr__,order,this->sortCacheEnabled,onlyTopLevelItems);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_005b3049:
  __stack_chk_fail();
}

Assistant:

QList<QGraphicsItem *> QGraphicsSceneBspTreeIndexPrivate::estimateItems(const QRectF &rect, Qt::SortOrder order,
                                                                        bool onlyTopLevelItems)
{
    Q_Q(QGraphicsSceneBspTreeIndex);
    if (onlyTopLevelItems && rect.isNull())
        return q->QGraphicsSceneIndex::estimateTopLevelItems(rect, order);

    purgeRemovedItems();
    _q_updateSortCache();
    Q_ASSERT(unindexedItems.isEmpty());

    QList<QGraphicsItem *> rectItems = bsp.items(rect, onlyTopLevelItems);
    if (onlyTopLevelItems) {
        for (int i = 0; i < untransformableItems.size(); ++i) {
            QGraphicsItem *item = untransformableItems.at(i);
            if (!item->d_ptr->parent) {
                rectItems << item;
            } else {
                item = item->topLevelItem();
                if (!rectItems.contains(item))
                    rectItems << item;
            }
        }
    } else {
        rectItems += untransformableItems;
    }

    sortItems(&rectItems, order, sortCacheEnabled, onlyTopLevelItems);
    return rectItems;
}